

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON_wString __thiscall
ON_FileSystemPath::FileNameFromPath(ON_FileSystemPath *this,wchar_t *path,bool bIncludeExtension)

{
  bool bIncludeExtension_local;
  wchar_t *path_local;
  ON_wString *fname;
  
  ON_wString::ON_wString((ON_wString *)this);
  if (bIncludeExtension) {
    SplitPath(path,(ON_wString *)0x0,(ON_wString *)0x0,(ON_wString *)this);
  }
  else {
    SplitPath(path,(ON_wString *)0x0,(ON_wString *)0x0,(ON_wString *)this,(ON_wString *)0x0);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::FileNameFromPath(
  const wchar_t* path,
  bool bIncludeExtension
)
{
  ON_wString fname;
  if ( bIncludeExtension )
    ON_FileSystemPath::SplitPath(path, nullptr, nullptr, &fname);
  else
    ON_FileSystemPath::SplitPath(path, nullptr, nullptr, &fname, nullptr);
  return fname;
}